

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identical-sequences-recognizer.cpp
# Opt level: O0

void __thiscall
mahjong::IdenticalSequencesRecognizer::check(IdenticalSequencesRecognizer *this,Meld *meld)

{
  bool bVar1;
  int local_64;
  pair<mahjong::Meld,_int> local_60;
  reference local_38;
  pair<mahjong::Meld,_int> *it;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<mahjong::Meld,_int>,_std::allocator<std::pair<mahjong::Meld,_int>_>_> *__range1;
  Meld *meld_local;
  IdenticalSequencesRecognizer *this_local;
  
  bVar1 = Meld::isTripletOrQuad(meld);
  if (!bVar1) {
    __end1 = std::
             vector<std::pair<mahjong::Meld,_int>,_std::allocator<std::pair<mahjong::Meld,_int>_>_>
             ::begin(&this->identity_infos);
    it = (pair<mahjong::Meld,_int> *)
         std::vector<std::pair<mahjong::Meld,_int>,_std::allocator<std::pair<mahjong::Meld,_int>_>_>
         ::end(&this->identity_infos);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::pair<mahjong::Meld,_int>_*,_std::vector<std::pair<mahjong::Meld,_int>,_std::allocator<std::pair<mahjong::Meld,_int>_>_>_>
                                       *)&it), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<std::pair<mahjong::Meld,_int>_*,_std::vector<std::pair<mahjong::Meld,_int>,_std::allocator<std::pair<mahjong::Meld,_int>_>_>_>
                 ::operator*(&__end1);
      bVar1 = Meld::isSame(&local_38->first,meld);
      if (bVar1) {
        local_38->second = local_38->second + 1;
        return;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<mahjong::Meld,_int>_*,_std::vector<std::pair<mahjong::Meld,_int>,_std::allocator<std::pair<mahjong::Meld,_int>_>_>_>
      ::operator++(&__end1);
    }
    local_64 = 1;
    std::pair<mahjong::Meld,_int>::pair<int,_true>(&local_60,meld,&local_64);
    std::vector<std::pair<mahjong::Meld,_int>,_std::allocator<std::pair<mahjong::Meld,_int>_>_>::
    push_back(&this->identity_infos,&local_60);
    std::pair<mahjong::Meld,_int>::~pair(&local_60);
  }
  return;
}

Assistant:

void IdenticalSequencesRecognizer::check(const Meld& meld)
{
	if (meld.isTripletOrQuad()) return;

	for (auto& it : identity_infos)
	{
		if (it.first.isSame(meld))
		{
			it.second++;
			return;
		}
	}

	identity_infos.push_back({ meld, 1 });
}